

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_motion.c
# Opt level: O0

int av1_hash_is_horizontal_perfect
              (YV12_BUFFER_CONFIG *picture,int block_size,int x_start,int y_start)

{
  int iVar1;
  int j_1;
  int i_1;
  int j;
  int i;
  uint16_t *p16;
  uint8_t *p;
  int stride;
  int y_start_local;
  int x_start_local;
  int block_size_local;
  YV12_BUFFER_CONFIG *picture_local;
  
  iVar1 = (picture->field_4).field_0.y_stride;
  p = (picture->field_5).buffers[0] + (long)x_start + (long)(y_start * iVar1);
  if ((picture->flags & 8U) == 0) {
    for (i_1 = 0; i_1 < block_size; i_1 = i_1 + 1) {
      for (j_1 = 1; j_1 < block_size; j_1 = j_1 + 1) {
        if (p[j_1] != *p) {
          return 0;
        }
      }
      p = p + iVar1;
    }
  }
  else {
    p16 = (uint16_t *)((long)p * 2);
    for (i = 0; i < block_size; i = i + 1) {
      for (j = 1; j < block_size; j = j + 1) {
        if (p16[j] != *p16) {
          return 0;
        }
      }
      p16 = p16 + iVar1;
    }
  }
  return 1;
}

Assistant:

int av1_hash_is_horizontal_perfect(const YV12_BUFFER_CONFIG *picture,
                                   int block_size, int x_start, int y_start) {
  const int stride = picture->y_stride;
  const uint8_t *p = picture->y_buffer + y_start * stride + x_start;

  if (picture->flags & YV12_FLAG_HIGHBITDEPTH) {
    const uint16_t *p16 = CONVERT_TO_SHORTPTR(p);
    for (int i = 0; i < block_size; i++) {
      for (int j = 1; j < block_size; j++) {
        if (p16[j] != p16[0]) {
          return 0;
        }
      }
      p16 += stride;
    }
  } else {
    for (int i = 0; i < block_size; i++) {
      for (int j = 1; j < block_size; j++) {
        if (p[j] != p[0]) {
          return 0;
        }
      }
      p += stride;
    }
  }

  return 1;
}